

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_hlsl_add_vertex_attribute_remap
          (spvc_compiler compiler,spvc_hlsl_vertex_attribute_remap *remap,size_t count)

{
  CompilerHLSL *this;
  spvc_context_s *this_00;
  spvc_result sVar1;
  char **ppcVar2;
  bool bVar3;
  HLSLVertexAttributeRemap re;
  string local_48;
  
  if (compiler->backend == SPVC_BACKEND_HLSL) {
    re.semantic._M_dataplus._M_p = (pointer)&re.semantic.field_2;
    re.semantic._M_string_length = 0;
    re.semantic.field_2._M_local_buf[0] = '\0';
    this = (CompilerHLSL *)
           (compiler->compiler)._M_t.
           super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
           ._M_t.
           super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
           .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl;
    ppcVar2 = &remap->semantic;
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      re.location = ((spvc_hlsl_vertex_attribute_remap *)(ppcVar2 + -1))->location;
      std::__cxx11::string::assign((char *)&re.semantic);
      spirv_cross::CompilerHLSL::add_vertex_attribute_remap(this,&re);
      ppcVar2 = ppcVar2 + 2;
    }
    std::__cxx11::string::~string((string *)&re.semantic);
    sVar1 = SPVC_SUCCESS;
  }
  else {
    this_00 = compiler->context;
    std::__cxx11::string::string
              ((string *)&local_48,"HLSL function used on a non-HLSL backend.",(allocator *)&re);
    spvc_context_s::report_error(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    sVar1 = SPVC_ERROR_INVALID_ARGUMENT;
  }
  return sVar1;
}

Assistant:

spvc_result spvc_compiler_hlsl_add_vertex_attribute_remap(spvc_compiler compiler,
                                                          const spvc_hlsl_vertex_attribute_remap *remap,
                                                          size_t count)
{
#if SPIRV_CROSS_C_API_HLSL
	if (compiler->backend != SPVC_BACKEND_HLSL)
	{
		compiler->context->report_error("HLSL function used on a non-HLSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	HLSLVertexAttributeRemap re;
	auto &hlsl = *static_cast<CompilerHLSL *>(compiler->compiler.get());
	for (size_t i = 0; i < count; i++)
	{
		re.location = remap[i].location;
		re.semantic = remap[i].semantic;
		hlsl.add_vertex_attribute_remap(re);
	}

	return SPVC_SUCCESS;
#else
	(void)remap;
	(void)count;
	compiler->context->report_error("HLSL function used on a non-HLSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}